

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

OutPt * ClipperLib::GetBottomPt(OutPt *pp)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  OutPt *btmPt1;
  OutPt *btmPt2;
  
  btmPt1 = pp->next;
  if (btmPt1 != pp) {
    btmPt2 = (OutPt *)0x0;
    do {
      lVar1 = (pp->pt).Y;
      lVar2 = (btmPt1->pt).Y;
      if (lVar1 < lVar2) {
LAB_0065dc87:
        pp = btmPt1;
        btmPt2 = (OutPt *)0x0;
      }
      else if (lVar2 == lVar1) {
        lVar1 = (pp->pt).X;
        lVar2 = (btmPt1->pt).X;
        if (lVar2 <= lVar1) {
          if (lVar2 < lVar1) goto LAB_0065dc87;
          if ((btmPt1->next != pp) && (btmPt1->prev != pp)) {
            btmPt2 = btmPt1;
          }
        }
      }
      btmPt1 = btmPt1->next;
    } while (btmPt1 != pp);
    if (btmPt2 != (OutPt *)0x0) {
      while (btmPt2 != btmPt1) {
        bVar3 = FirstIsBottomPt(btmPt1,btmPt2);
        if (!bVar3) {
          pp = btmPt2;
        }
        do {
          do {
            btmPt2 = btmPt2->next;
          } while ((btmPt2->pt).X != (pp->pt).X);
        } while ((btmPt2->pt).Y != (pp->pt).Y);
      }
    }
  }
  return pp;
}

Assistant:

OutPt* GetBottomPt(OutPt *pp)
{
  OutPt* dups = 0;
  OutPt* p = pp->next;
  while (p != pp)
  {
    if (p->pt.Y > pp->pt.Y)
    {
      pp = p;
      dups = 0;
    }
    else if (p->pt.Y == pp->pt.Y && p->pt.X <= pp->pt.X)
    {
      if (p->pt.X < pp->pt.X)
      {
        dups = 0;
        pp = p;
      } else
      {
        if (p->next != pp && p->prev != pp) dups = p;
      }
    }
    p = p->next;
  }
  if (dups)
  {
    //there appears to be at least 2 vertices at bottomPt so ...
    while (dups != p)
    {
      if (!FirstIsBottomPt(p, dups)) pp = dups;
      dups = dups->next;
      while (!PointsEqual(dups->pt, pp->pt)) dups = dups->next;
    }
  }
  return pp;
}